

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall FBehavior::FindStringInChunk(FBehavior *this,DWORD *names,char *varname)

{
  int iVar1;
  uint local_2c;
  DWORD i;
  char *varname_local;
  DWORD *names_local;
  FBehavior *this_local;
  
  if (names != (DWORD *)0x0) {
    for (local_2c = 0; local_2c < names[2]; local_2c = local_2c + 1) {
      iVar1 = strcasecmp(varname,(char *)((long)names + (ulong)names[local_2c + 3] + 8));
      if (iVar1 == 0) {
        return local_2c;
      }
    }
  }
  return -1;
}

Assistant:

int FBehavior::FindStringInChunk (DWORD *names, const char *varname) const
{
	if (names != NULL)
	{
		DWORD i;

		for (i = 0; i < LittleLong(names[2]); ++i)
		{
			if (stricmp (varname, (char *)(names + 2) + LittleLong(names[3+i])) == 0)
			{
				return (int)i;
			}
		}
	}
	return -1;
}